

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void AddInterfaceEntries(cmGeneratorTarget *thisTarget,string *config,string *prop,
                        vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                        *entries)

{
  cmGeneratorTarget *gt;
  cmLinkImplementationLibraries *pcVar1;
  long *plVar2;
  long *plVar3;
  element_type *peVar4;
  size_type *psVar5;
  pointer pcVar6;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmGeneratorExpression ge;
  string genex;
  string uniqueName;
  cmGeneratorExpression local_108;
  undefined1 local_f8 [32];
  undefined1 local_d8 [16];
  string local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  cmListFileBacktrace local_80;
  vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
  *local_70;
  string *local_68;
  cmGeneratorTarget *local_60;
  pointer local_58;
  string local_50;
  
  local_70 = (vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
              *)entries;
  local_68 = prop;
  local_60 = thisTarget;
  pcVar1 = cmGeneratorTarget::GetLinkImplementationLibrariesInternal(thisTarget,config,thisTarget);
  if (pcVar1 != (cmLinkImplementationLibraries *)0x0) {
    pcVar6 = (pcVar1->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_58 = (pcVar1->Libraries).
               super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (pcVar6 != local_58) {
      do {
        gt = (pcVar6->super_cmLinkItem).Target;
        if (gt != (cmGeneratorTarget *)0x0) {
          cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_
                    (&local_50,local_60->LocalGenerator->GlobalGenerator,gt);
          plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x532b1c);
          local_f8._16_8_ = local_f8 + 0x20;
          plVar3 = plVar2 + 2;
          if ((long *)*plVar2 == plVar3) {
            local_d8._0_8_ = *plVar3;
            local_d8._8_8_ = plVar2[3];
          }
          else {
            local_d8._0_8_ = *plVar3;
            local_f8._16_8_ = (long *)*plVar2;
          }
          local_f8._24_8_ = plVar2[1];
          *plVar2 = (long)plVar3;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append(local_f8 + 0x10);
          local_108.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_f8;
          peVar4 = (element_type *)(plVar2 + 2);
          if ((element_type *)*plVar2 == peVar4) {
            local_f8._0_8_ = (peVar4->field_0).Bottom.State;
            local_f8._8_8_ = plVar2[3];
          }
          else {
            local_f8._0_8_ = (peVar4->field_0).Bottom.State;
            local_108.Backtrace.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)*plVar2;
          }
          local_108.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[1];
          *plVar2 = (long)peVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_108,(ulong)(local_68->_M_dataplus)._M_p);
          psVar5 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_c8.field_2._M_allocated_capacity = *psVar5;
            local_c8.field_2._8_8_ = plVar2[3];
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar5;
            local_c8._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_c8._M_string_length = plVar2[1];
          *plVar2 = (long)psVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append(local_d8 + 0x10);
          plVar3 = plVar2 + 2;
          if ((long *)*plVar2 == plVar3) {
            local_90 = *plVar3;
            lStack_88 = plVar2[3];
            local_a0 = &local_90;
          }
          else {
            local_90 = *plVar3;
            local_a0 = (long *)*plVar2;
          }
          local_98 = plVar2[1];
          *plVar2 = (long)plVar3;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if (local_108.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (element_type *)local_f8) {
            operator_delete(local_108.Backtrace.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                               *)local_f8._0_8_)->_M_t)._M_impl.field_0x1);
          }
          if ((undefined1 *)local_f8._16_8_ != local_f8 + 0x20) {
            operator_delete((void *)local_f8._16_8_,(ulong)(local_d8._0_8_ + 1));
          }
          local_80.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (pcVar6->super_cmLinkItem).Backtrace.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_80.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (pcVar6->super_cmLinkItem).Backtrace.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (local_80.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_80.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_80.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_80.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_80.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          cmGeneratorExpression::cmGeneratorExpression
                    ((cmGeneratorExpression *)(local_d8 + 0x10),&local_80);
          if (local_80.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          cmGeneratorExpression::Parse(&local_108,(string *)(local_d8 + 0x10));
          peVar4 = local_108.Backtrace.TopEntry.
                   super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          *(undefined1 *)
           ((long)&local_108.Backtrace.TopEntry.
                   super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr[4].field_0 + 8) = 1;
          local_f8._16_8_ = operator_new(0x28);
          local_108.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          *(pointer *)(local_f8._16_8_ + 8) = pcVar6;
          *(undefined8 *)(local_f8._16_8_ + 0x10) = 0;
          *(undefined8 *)(local_f8._16_8_ + 0x18) = 0;
          *(undefined ***)local_f8._16_8_ = &PTR__TargetPropertyEntryGenex_00675e70;
          *(element_type **)(local_f8._16_8_ + 0x20) = peVar4;
          local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
          ::emplace_back<cmGeneratorTarget::TargetPropertyEntry*>
                    (local_70,(TargetPropertyEntry **)(local_f8 + 0x10));
          std::
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&local_a8);
          std::
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&local_108);
          cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_d8 + 0x10));
          if (local_a0 != &local_90) {
            operator_delete(local_a0,local_90 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar6 = pcVar6 + 1;
      } while (pcVar6 != local_58);
    }
  }
  return;
}

Assistant:

static void AddInterfaceEntries(
  cmGeneratorTarget const* thisTarget, std::string const& config,
  std::string const& prop,
  std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries)
{
  if (cmLinkImplementationLibraries const* impl =
        thisTarget->GetLinkImplementationLibraries(config)) {
    for (cmLinkImplItem const& lib : impl->Libraries) {
      if (lib.Target) {
        std::string uniqueName =
          thisTarget->GetGlobalGenerator()->IndexGeneratorTargetUniquely(
            lib.Target);
        std::string genex =
          "$<TARGET_PROPERTY:" + std::move(uniqueName) + "," + prop + ">";
        cmGeneratorExpression ge(lib.Backtrace);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(genex);
        cge->SetEvaluateForBuildsystem(true);
        entries.push_back(new TargetPropertyEntryGenex(std::move(cge), lib));
      }
    }
  }
}